

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_psnr_enc.c
# Opt level: O0

int WebPPictureDistortion(WebPPicture *src,WebPPicture *ref,int type,float *results)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long in_RCX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int offset;
  size_t stride1;
  size_t stride0;
  float distortion;
  double total_distortion;
  double total_size;
  WebPPicture p1;
  WebPPicture p0;
  int ok;
  int c;
  int h;
  int w;
  double in_stack_fffffffffffffd78;
  int in_stack_fffffffffffffd80;
  int in_stack_fffffffffffffd84;
  WebPPicture *in_stack_fffffffffffffd88;
  double in_stack_fffffffffffffd90;
  float local_268;
  undefined4 in_stack_fffffffffffffdb0;
  float in_stack_fffffffffffffdb4;
  uint8_t *ref_00;
  double dVar4;
  int in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdcc;
  size_t in_stack_fffffffffffffde0;
  int in_stack_fffffffffffffde8;
  uint32_t in_stack_fffffffffffffdf0 [2];
  float *in_stack_fffffffffffffdf8;
  int local_138;
  int local_e8;
  int local_38;
  int local_34;
  int local_4;
  
  local_38 = 0;
  dVar4 = 0.0;
  ref_00 = (uint8_t *)0x0;
  if ((((in_RDI == 0) || (in_RSI == 0)) || (*(int *)(in_RDI + 8) != *(int *)(in_RSI + 8))) ||
     ((*(int *)(in_RDI + 0xc) != *(int *)(in_RSI + 0xc) || (in_RCX == 0)))) {
    local_4 = 0;
  }
  else {
    VP8SSIMDspInit();
    iVar2 = WebPPictureInit((WebPPicture *)0x15bbb6);
    if ((iVar2 == 0) || (iVar2 = WebPPictureInit((WebPPicture *)0x15bbc5), iVar2 == 0)) {
      local_4 = 0;
    }
    else {
      iVar2 = *(int *)(in_RDI + 8);
      iVar1 = *(int *)(in_RDI + 0xc);
      iVar3 = WebPPictureView(in_stack_fffffffffffffd88,in_stack_fffffffffffffd84,
                              in_stack_fffffffffffffd80,
                              (int)((ulong)in_stack_fffffffffffffd78 >> 0x20),
                              SUB84(in_stack_fffffffffffffd78,0),(WebPPicture *)0x15bc26);
      if ((((iVar3 != 0) &&
           (iVar3 = WebPPictureView(in_stack_fffffffffffffd88,in_stack_fffffffffffffd84,
                                    in_stack_fffffffffffffd80,
                                    (int)((ulong)in_stack_fffffffffffffd78 >> 0x20),
                                    SUB84(in_stack_fffffffffffffd78,0),(WebPPicture *)0x15bc55),
           iVar3 != 0)) &&
          ((local_138 != 0 ||
           (iVar3 = WebPPictureYUVAToARGB((WebPPicture *)in_stack_fffffffffffffdf0), iVar3 != 0))))
         && ((in_stack_fffffffffffffdc8 != 0 ||
             (iVar3 = WebPPictureYUVAToARGB((WebPPicture *)in_stack_fffffffffffffdf0), iVar3 != 0)))
         ) {
        for (local_34 = 0; local_34 < 4; local_34 = local_34 + 1) {
          in_stack_fffffffffffffd90 = (double)(in_RCX + (long)local_34 * 4);
          in_stack_fffffffffffffd88 = (WebPPicture *)&stack0xfffffffffffffdb4;
          in_stack_fffffffffffffd78 = 1.97626258336499e-323;
          in_stack_fffffffffffffd80 = in_EDX;
          iVar3 = WebPPlaneDistortion((uint8_t *)
                                      CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                                      (size_t)dVar4,ref_00,
                                      CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                                      (int)((ulong)((long)local_e8 << 2) >> 0x20),
                                      (int)((long)local_e8 << 2),in_stack_fffffffffffffde0,
                                      in_stack_fffffffffffffde8,(float *)in_stack_fffffffffffffdf0,
                                      in_stack_fffffffffffffdf8);
          if (iVar3 == 0) goto LAB_0015be13;
          ref_00 = (uint8_t *)((double)in_stack_fffffffffffffdb4 + (double)ref_00);
          dVar4 = (double)(iVar2 * iVar1) + dVar4;
        }
        if (in_EDX == 1) {
          dVar4 = GetLogSSIM(in_stack_fffffffffffffd90,(double)in_stack_fffffffffffffd88);
        }
        else {
          dVar4 = GetPSNR((double)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                          in_stack_fffffffffffffd78);
        }
        local_268 = (float)dVar4;
        *(float *)(in_RCX + 0x10) = local_268;
        local_38 = 1;
      }
LAB_0015be13:
      WebPPictureFree((WebPPicture *)0x15be20);
      WebPPictureFree((WebPPicture *)0x15be2a);
      local_4 = local_38;
    }
  }
  return local_4;
}

Assistant:

int WebPPictureDistortion(const WebPPicture* src, const WebPPicture* ref,
                          int type, float results[5]) {
  int w, h, c;
  int ok = 0;
  WebPPicture p0, p1;
  double total_size = 0., total_distortion = 0.;
  if (src == NULL || ref == NULL ||
      src->width != ref->width || src->height != ref->height ||
      results == NULL) {
    return 0;
  }

  VP8SSIMDspInit();
  if (!WebPPictureInit(&p0) || !WebPPictureInit(&p1)) return 0;
  w = src->width;
  h = src->height;
  if (!WebPPictureView(src, 0, 0, w, h, &p0)) goto Error;
  if (!WebPPictureView(ref, 0, 0, w, h, &p1)) goto Error;

  // We always measure distortion in ARGB space.
  if (p0.use_argb == 0 && !WebPPictureYUVAToARGB(&p0)) goto Error;
  if (p1.use_argb == 0 && !WebPPictureYUVAToARGB(&p1)) goto Error;
  for (c = 0; c < 4; ++c) {
    float distortion;
    const size_t stride0 = 4 * (size_t)p0.argb_stride;
    const size_t stride1 = 4 * (size_t)p1.argb_stride;
    // results are reported as BGRA
    const int offset = c ^ BLUE_OFFSET;
    if (!WebPPlaneDistortion((const uint8_t*)p0.argb + offset, stride0,
                             (const uint8_t*)p1.argb + offset, stride1,
                             w, h, 4, type, &distortion, results + c)) {
      goto Error;
    }
    total_distortion += distortion;
    total_size += w * h;
  }

  results[4] = (type == 1) ? (float)GetLogSSIM(total_distortion, total_size)
                           : (float)GetPSNR(total_distortion, total_size);
  ok = 1;

 Error:
  WebPPictureFree(&p0);
  WebPPictureFree(&p1);
  return ok;
}